

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

uchar FSE_decodeSymbol(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  undefined4 uVar1;
  uint uVar2;
  size_t lowBits;
  ushort uStack_6c;
  uchar uStack_6a;
  BYTE symbol;
  U32 nbBits;
  FSE_decode_t DInfo;
  BIT_DStream_t *bitD_local;
  FSE_DState_t *DStatePtr_local;
  size_t value;
  U32 regMask;
  
  uVar1 = *(undefined4 *)((long)DStatePtr->table + DStatePtr->state * 4);
  symbol = (BYTE)((uint)uVar1 >> 0x18);
  uStack_6a = (uchar)((uint)uVar1 >> 0x10);
  uVar2 = bitD->bitsConsumed;
  if (0x1f < symbol) {
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  bitD->bitsConsumed = (uint)symbol + bitD->bitsConsumed;
  uStack_6c = (ushort)uVar1;
  DStatePtr->state =
       (ulong)uStack_6c +
       (bitD->bitContainer >> (('@' - (char)uVar2) - symbol & 0x3f) & (1L << (symbol & 0x3f)) - 1U);
  return uStack_6a;
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbol(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBits(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}